

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::str<float_const&>(String *__return_storage_ptr__,kj *this,float *params)

{
  kj *this_00;
  float *value;
  CappedArray<char,_24UL> *params_00;
  CappedArray<char,_24UL> local_38;
  kj *local_18;
  float *params_local;
  
  local_18 = this;
  params_local = (float *)__return_storage_ptr__;
  this_00 = (kj *)fwd<float_const&>((float *)this);
  toCharSequence<float_const&>(&local_38,this_00,value);
  _::concat<kj::CappedArray<char,24ul>>(__return_storage_ptr__,(_ *)&local_38,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}